

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlExpression.cpp
# Opt level: O2

bool __thiscall
GdlBinaryExpression::GenerateSetBitsOp
          (GdlBinaryExpression *this,uint32_t fxdRuleVersion,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *vbOutput,int iritCurrent,
          vector<int,_std::allocator<int>_> *pviritInput,int nIIndex,bool fAttachAt,int iritAttachTo
          )

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  bool bVar1;
  char cVar2;
  byte bVar3;
  long lVar4;
  long *plVar5;
  long lVar6;
  uchar local_a5;
  int nMask;
  int nValue;
  int local_9c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_98;
  string staOp12;
  string staOp1;
  string staOp;
  
  local_9c = nIIndex;
  GrcSymbolTableEntry::FullName_abi_cxx11_(&staOp,this->m_psymOperator);
  bVar1 = std::operator==(&staOp,"|");
  if (bVar1) {
    if (this->m_pexpOperand1 == (GdlExpression *)0x0) {
      lVar4 = 0;
    }
    else {
      lVar4 = __dynamic_cast(this->m_pexpOperand1,&GdlExpression::typeinfo,&typeinfo,0);
    }
    if (this->m_pexpOperand2 != (GdlExpression *)0x0) {
      bVar1 = false;
      local_98 = vbOutput;
      plVar5 = (long *)__dynamic_cast(this->m_pexpOperand2,&GdlExpression::typeinfo,
                                      &GdlNumericExpression::typeinfo,0);
      if (plVar5 == (long *)0x0 || lVar4 == 0) goto LAB_0013daa0;
      GrcSymbolTableEntry::FullName_abi_cxx11_(&staOp1,*(GrcSymbolTableEntry **)(lVar4 + 0x38));
      if (*(long *)(lVar4 + 0x48) == 0) {
        lVar6 = 0;
      }
      else {
        lVar6 = __dynamic_cast(*(long *)(lVar4 + 0x48),&GdlExpression::typeinfo,
                               &GdlUnaryExpression::typeinfo,0);
      }
      bVar1 = std::operator==(&staOp1,"&");
      if ((bVar1) && (lVar6 != 0)) {
        GrcSymbolTableEntry::FullName_abi_cxx11_(&staOp12,*(GrcSymbolTableEntry **)(lVar6 + 0x38));
        bVar1 = std::operator==(&staOp12,"~");
        if (bVar1) {
          cVar2 = (**(code **)(**(long **)(lVar6 + 0x40) + 0x38))(*(long **)(lVar6 + 0x40),&nMask,0)
          ;
          this_00 = local_98;
          if (cVar2 != '\0') {
            bVar3 = (**(code **)(*plVar5 + 0x38))(plVar5,&nValue,0);
            if ((bVar3 & nMask < 0x10000) == 1) {
              (**(code **)(**(long **)(lVar4 + 0x40) + 0xe0))
                        (*(long **)(lVar4 + 0x40),fxdRuleVersion,this_00,iritCurrent,pviritInput,
                         local_9c,fAttachAt,iritAttachTo,0);
              local_a5 = 'A';
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
              emplace_back<unsigned_char>(this_00,&local_a5);
              local_a5 = nMask._1_1_;
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
              emplace_back<unsigned_char>(this_00,&local_a5);
              local_a5 = (uchar)nMask;
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
              emplace_back<unsigned_char>(this_00,&local_a5);
              local_a5 = nValue._1_1_;
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
              emplace_back<unsigned_char>(this_00,&local_a5);
              local_a5 = (uchar)nValue;
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
              emplace_back<unsigned_char>(this_00,&local_a5);
              std::__cxx11::string::~string((string *)&staOp12);
              std::__cxx11::string::~string((string *)&staOp1);
              bVar1 = true;
              goto LAB_0013daa0;
            }
          }
        }
        std::__cxx11::string::~string((string *)&staOp12);
      }
      std::__cxx11::string::~string((string *)&staOp1);
    }
  }
  bVar1 = false;
LAB_0013daa0:
  std::__cxx11::string::~string((string *)&staOp);
  return bVar1;
}

Assistant:

bool GdlBinaryExpression::GenerateSetBitsOp(uint32_t fxdRuleVersion, std::vector<gr::byte> & vbOutput,
	int iritCurrent, std::vector<int> * pviritInput, int nIIndex,
	bool fAttachAt, int iritAttachTo)
{
	std::string staOp = m_psymOperator->FullName();
	if (staOp == "|")
	{
		GdlBinaryExpression * pexp1And = dynamic_cast<GdlBinaryExpression *>(m_pexpOperand1);
		GdlNumericExpression * pexp2Value = dynamic_cast<GdlNumericExpression *>(m_pexpOperand2);
		if (pexp1And && pexp2Value)
		{
			std::string staOp1 = pexp1And->Operator()->FullName();
			GdlUnaryExpression * pexp1And2Not = dynamic_cast<GdlUnaryExpression *>(pexp1And->Operand2());
			if (staOp1 == "&" && pexp1And2Not)
			{
				std::string staOp12 = pexp1And2Not->Operator()->FullName();
				if (staOp12 == "~")
				{
					int nMask, nValue;
					if (pexp1And2Not->Operand()->ResolveToInteger(&nMask, false)
						&& pexp2Value->ResolveToInteger(&nValue, false)
						&& nMask <= 0xFFFF)
					{
						// Okay, it's the right form.
						pexp1And->Operand1()->GenerateEngineCode(fxdRuleVersion, vbOutput, iritCurrent,
							pviritInput, nIIndex, fAttachAt, iritAttachTo, NULL);
						vbOutput.push_back(kopSetBits);
						vbOutput.push_back(nMask >> 8);
						vbOutput.push_back(nMask & 0x000000FF);
						vbOutput.push_back(nValue >> 8);
						vbOutput.push_back(nValue & 0x000000FF);
						return true;
					}
				}
			}
		}
	}
	
	return false;
}